

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_get_frame_size(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  undefined4 *puVar2;
  long lVar3;
  undefined8 *local_50;
  AV1_COMMON *cm;
  FrameWorkerData *frame_worker_data;
  AVxWorker *worker;
  int *frame_size;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t *ctx_local;
  aom_codec_err_t local_4;
  
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_50 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_50 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = local_50 + 1;
  }
  puVar2 = (undefined4 *)*local_50;
  if (puVar2 == (undefined4 *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else if (ctx->frame_worker == (AVxWorker *)0x0) {
    local_4 = AOM_CODEC_ERROR;
  }
  else {
    lVar3 = *ctx->frame_worker->data1;
    *puVar2 = *(undefined4 *)(lVar3 + 0x3b98);
    puVar2[1] = *(undefined4 *)(lVar3 + 0x3b9c);
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_frame_size(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  int *const frame_size = va_arg(args, int *);

  if (frame_size) {
    if (ctx->frame_worker) {
      AVxWorker *const worker = ctx->frame_worker;
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      const AV1_COMMON *const cm = &frame_worker_data->pbi->common;
      frame_size[0] = cm->width;
      frame_size[1] = cm->height;
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }

  return AOM_CODEC_INVALID_PARAM;
}